

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void rest_regions(memfile *mf,level *lev,boolean ghostly)

{
  int8_t iVar1;
  int16_t iVar2;
  int32_t iVar3;
  uint uVar4;
  uint len;
  region **pprVar5;
  region *prVar6;
  nhrect *pnVar7;
  uint *puVar8;
  char *pcVar9;
  short local_50;
  region *r;
  char *msg_buf;
  long tmstamp;
  uint len2;
  uint len1;
  int j;
  int i;
  boolean ghostly_local;
  level *lev_local;
  memfile *mf_local;
  
  free_regions(lev);
  mfmagic_check(mf,0x49474552);
  iVar3 = mread32(mf);
  if (ghostly == '\0') {
    msg_buf = (char *)((ulong)moves - (long)iVar3);
  }
  else {
    msg_buf = (char *)0x0;
  }
  iVar3 = mread32(mf);
  lev->n_regions = iVar3;
  lev->max_regions = lev->n_regions;
  if (0 < lev->n_regions) {
    pprVar5 = (region **)malloc((long)lev->n_regions << 3);
    lev->regions = pprVar5;
  }
  for (len1 = 0; (int)len1 < lev->n_regions; len1 = len1 + 1) {
    prVar6 = (region *)malloc(0x58);
    lev->regions[(int)len1] = prVar6;
    prVar6 = lev->regions[(int)len1];
    memset(prVar6,0,0x58);
    prVar6->lev = lev;
    mread(mf,&prVar6->bounding_box,4);
    uVar4 = mread32(mf);
    prVar6->attach_2_m = uVar4;
    iVar3 = mread32(mf);
    prVar6->effect_id = iVar3;
    iVar3 = mread32(mf);
    prVar6->arg = iVar3;
    iVar2 = mread16(mf);
    prVar6->nrects = iVar2;
    if (0 < prVar6->nrects) {
      pnVar7 = (nhrect *)malloc((long)prVar6->nrects << 2);
      prVar6->rects = pnVar7;
    }
    for (len2 = 0; (int)len2 < (int)prVar6->nrects; len2 = len2 + 1) {
      mread(mf,prVar6->rects + (int)len2,4);
    }
    iVar2 = mread16(mf);
    prVar6->ttl = iVar2;
    iVar2 = mread16(mf);
    prVar6->expire_f = iVar2;
    iVar2 = mread16(mf);
    prVar6->can_enter_f = iVar2;
    iVar2 = mread16(mf);
    prVar6->enter_f = iVar2;
    iVar2 = mread16(mf);
    prVar6->can_leave_f = iVar2;
    iVar2 = mread16(mf);
    prVar6->leave_f = iVar2;
    iVar2 = mread16(mf);
    prVar6->inside_f = iVar2;
    iVar2 = mread16(mf);
    prVar6->n_monst = iVar2;
    prVar6->max_monst = prVar6->n_monst;
    iVar1 = mread8(mf);
    prVar6->player_flags = iVar1;
    iVar1 = mread8(mf);
    prVar6->attach_2_u = iVar1;
    iVar1 = mread8(mf);
    prVar6->visible = iVar1;
    if (0 < prVar6->n_monst) {
      puVar8 = (uint *)malloc((long)prVar6->n_monst << 2);
      prVar6->monsters = puVar8;
    }
    for (len2 = 0; (int)len2 < (int)prVar6->n_monst; len2 = len2 + 1) {
      uVar4 = mread32(mf);
      prVar6->monsters[(int)len2] = uVar4;
    }
    iVar2 = mread16(mf);
    uVar4 = (uint)iVar2;
    iVar2 = mread16(mf);
    len = (uint)iVar2;
    if (uVar4 != 0) {
      pcVar9 = (char *)malloc((ulong)uVar4);
      mread(mf,pcVar9,uVar4);
      pcVar9[uVar4 - 1] = '\0';
      prVar6->enter_msg = pcVar9;
    }
    if (len != 0) {
      pcVar9 = (char *)malloc((ulong)len);
      mread(mf,pcVar9,len);
      pcVar9[len - 1] = '\0';
      prVar6->leave_msg = pcVar9;
    }
    if (-1 < prVar6->ttl) {
      if ((long)msg_buf < (long)prVar6->ttl) {
        local_50 = prVar6->ttl - (short)msg_buf;
      }
      else {
        local_50 = 0;
      }
      prVar6->ttl = local_50;
    }
    if (ghostly != '\0') {
      prVar6->player_flags = prVar6->player_flags & 0xfe;
      prVar6->player_flags = prVar6->player_flags | 2;
    }
  }
  len1 = lev->n_regions;
  while (len1 = len1 - 1, -1 < (int)len1) {
    if (lev->regions[(int)len1]->ttl == 0) {
      remove_region(lev->regions[(int)len1]);
    }
    else if ((ghostly != '\0') && (0 < lev->regions[(int)len1]->n_monst)) {
      reset_region_mids(lev->regions[(int)len1]);
    }
  }
  return;
}

Assistant:

void rest_regions(struct memfile *mf, struct level *lev,
		  boolean ghostly) /* If a bones file restore */
{
    int i, j;
    unsigned len1, len2;
    long tmstamp;
    char *msg_buf;
    struct region *r;

    free_regions(lev);		/* Just for security */
    mfmagic_check(mf, REGION_MAGIC);
    tmstamp = mread32(mf);
    if (ghostly)
	tmstamp = 0;
    else
	tmstamp = (moves - tmstamp);
    lev->n_regions = mread32(mf);
    lev->max_regions = lev->n_regions;
    if (lev->n_regions > 0)
	lev->regions = malloc(sizeof (struct region *) * lev->n_regions);
    
    for (i = 0; i < lev->n_regions; i++) {
	lev->regions[i] = malloc(sizeof (struct region));
	
	r = lev->regions[i];
	memset(r, 0, sizeof(struct region));
	
	r->lev = lev;
	
	mread(mf, &r->bounding_box, sizeof (struct nhrect));
	r->attach_2_m = mread32(mf);
	r->effect_id = mread32(mf);
	r->arg = mread32(mf);
	r->nrects = mread16(mf);
	if (r->nrects > 0)
	    r->rects = malloc(sizeof (struct nhrect) * r->nrects);
	for (j = 0; j < r->nrects; j++)
	    mread(mf, &r->rects[j], sizeof (struct nhrect));
	r->ttl = mread16(mf);
	r->expire_f = mread16(mf);
	r->can_enter_f = mread16(mf);
	r->enter_f = mread16(mf);
	r->can_leave_f = mread16(mf);
	r->leave_f = mread16(mf);
	r->inside_f = mread16(mf);
	r->n_monst = mread16(mf);
	r->max_monst = r->n_monst;
	r->player_flags = mread8(mf);
	r->attach_2_u = mread8(mf);
	r->visible = mread8(mf);
	
	if (r->n_monst > 0)
	    r->monsters = malloc(sizeof (unsigned) * r->n_monst);
	for (j = 0; j < r->n_monst; j++)
	    r->monsters[j] = mread32(mf);
	
	len1 = mread16(mf);
	len2 = mread16(mf);
	
	if (len1 > 0) {
	    msg_buf = malloc(len1);
	    mread(mf, msg_buf, len1);
	    msg_buf[len1 - 1] = '\0';
	    r->enter_msg = msg_buf;
	}
	
	if (len2 > 0) {
	    msg_buf = malloc(len2);
	    mread(mf, msg_buf, len2);
	    msg_buf[len2 - 1] = '\0';
	    r->leave_msg = msg_buf;
	}

	/* check for expired region */
	if (r->ttl >= 0)
	    r->ttl = (r->ttl > tmstamp) ? r->ttl - tmstamp : 0;
	
	if (ghostly) {	/* settings pertained to old player */
	    clear_hero_inside(r);
	    clear_heros_fault(r);
	}
    }
    /* remove expired lev->regions, do not trigger the expire_f callback (yet!);
       also update monster lists if this data is coming from a bones file */
    for (i = lev->n_regions - 1; i >= 0; i--)
	if (lev->regions[i]->ttl == 0)
	    remove_region(lev->regions[i]);
	else if (ghostly && lev->regions[i]->n_monst > 0)
	    reset_region_mids(lev->regions[i]);
}